

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O2

void __thiscall
t_rs_generator::render_const_value
          (t_rs_generator *this,t_type *ttype,t_const_value *tvalue,bool is_owned)

{
  int *piVar1;
  int iVar2;
  ostream *poVar3;
  int64_t iVar4;
  ofstream_with_content_based_conditional_update *poVar5;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  undefined4 extraout_var_00;
  t_const_value *extraout_RDX;
  t_const_value *extraout_RDX_00;
  t_const_value *ptVar6;
  char *pcVar7;
  undefined1 auVar8 [12];
  string local_70;
  string local_50;
  
  do {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
    if ((char)iVar2 != '\0') {
      switch(*(undefined4 *)&ttype[1].super_t_doc._vptr_t_doc) {
      case 1:
        iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[7])(ttype);
        poVar5 = &this->f_gen_;
        if ((char)iVar2 == '\0') {
          poVar3 = std::operator<<((ostream *)poVar5,"\"");
          std::__cxx11::string::string((string *)&local_70,(string *)&tvalue->stringVal_);
          poVar3 = std::operator<<(poVar3,(string *)&local_70);
          std::operator<<(poVar3,"\"");
          std::__cxx11::string::~string((string *)&local_70);
          if ((is_owned & 1U) != 0) {
            std::operator<<((ostream *)poVar5,".to_owned()");
          }
        }
        else {
          if ((is_owned & 1U) == 0) {
            poVar3 = std::operator<<((ostream *)poVar5,"b\"");
            std::__cxx11::string::string((string *)&local_70,(string *)&tvalue->stringVal_);
            poVar3 = std::operator<<(poVar3,(string *)&local_70);
            std::operator<<(poVar3,"\"");
          }
          else {
            poVar3 = std::operator<<((ostream *)poVar5,"\"");
            std::__cxx11::string::string((string *)&local_70,(string *)&tvalue->stringVal_);
            poVar3 = std::operator<<(poVar3,(string *)&local_70);
            poVar3 = std::operator<<(poVar3,"\"");
            std::operator<<(poVar3,".to_owned().into_bytes()");
          }
LAB_00297b3c:
          std::__cxx11::string::~string((string *)&local_70);
        }
        return;
      case 2:
        poVar5 = &this->f_gen_;
        iVar4 = t_const_value::get_integer(tvalue);
        pcVar7 = "true";
        if (iVar4 == 0) {
          pcVar7 = "false";
        }
        break;
      case 3:
      case 4:
      case 5:
      case 6:
        t_const_value::get_integer(tvalue);
        std::ostream::_M_insert<long>((long)&this->f_gen_);
        return;
      case 7:
        std::operator<<((ostream *)&this->f_gen_,"OrderedFloat::from(");
        poVar5 = (ofstream_with_content_based_conditional_update *)
                 std::ostream::_M_insert<double>(tvalue->doubleVal_);
        pcVar7 = "_f64)";
        break;
      default:
        auVar8 = __cxa_allocate_exception(0x20);
        t_base_type::t_base_name_abi_cxx11_
                  (&local_70,(t_base_type *)(ulong)*(uint *)&ttype[1].super_t_doc._vptr_t_doc,
                   auVar8._8_4_);
        std::operator+(auVar8._0_8_,"cannot generate const value for ",&local_70);
        __cxa_throw(auVar8._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      std::operator<<((ostream *)poVar5,pcVar7);
      return;
    }
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[9])(ttype);
    if ((char)iVar2 == '\0') {
      iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
      if ((char)iVar2 == '\0') {
        iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
        ptVar6 = extraout_RDX;
        if (((char)iVar2 != '\0') ||
           (iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype), ptVar6 = extraout_RDX_00,
           (char)iVar2 != '\0')) {
          render_const_struct(this,ttype,ptVar6);
          return;
        }
        iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xd])(ttype);
        if ((char)iVar2 == '\0') {
          __return_storage_ptr__ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
          iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
          std::operator+(__return_storage_ptr__,"cannot generate const value for ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(extraout_var,iVar2));
LAB_00297bc6:
          __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                      std::__cxx11::string::~string);
        }
        t_generator::indent_abi_cxx11_(&local_70,&this->super_t_generator);
        poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_70);
        poVar3 = std::operator<<(poVar3,"{");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_70);
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + 1;
        iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
        if ((char)iVar2 == '\0') {
          iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
          if ((char)iVar2 == '\0') {
            iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
            if ((char)iVar2 == '\0') {
              __return_storage_ptr__ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __cxa_allocate_exception(0x20);
              iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
              std::operator+(__return_storage_ptr__,"cannot generate const container value for ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(extraout_var_00,iVar2));
              goto LAB_00297bc6;
            }
            render_const_map(this,ttype,tvalue);
          }
          else {
            render_const_set(this,ttype,tvalue);
          }
        }
        else {
          render_const_list(this,ttype,tvalue);
        }
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + -1;
        t_generator::indent_abi_cxx11_(&local_70,&this->super_t_generator);
        poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_70);
        poVar3 = std::operator<<(poVar3,"}");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      }
      else {
        poVar5 = &this->f_gen_;
        t_generator::indent_abi_cxx11_(&local_70,&this->super_t_generator);
        poVar3 = std::operator<<((ostream *)poVar5,(string *)&local_70);
        poVar3 = std::operator<<(poVar3,"{");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_70);
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + 1;
        t_generator::indent_abi_cxx11_(&local_70,&this->super_t_generator);
        poVar3 = std::operator<<((ostream *)poVar5,(string *)&local_70);
        to_rust_type_abi_cxx11_(&local_50,this,ttype);
        poVar3 = std::operator<<(poVar3,(string *)&local_50);
        poVar3 = std::operator<<(poVar3,"::try_from(");
        t_const_value::get_integer(tvalue);
        poVar3 = std::ostream::_M_insert<long>((long)poVar3);
        poVar3 = std::operator<<(poVar3,").expect(\"expecting valid const value\")");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + -1;
        t_generator::indent_abi_cxx11_(&local_70,&this->super_t_generator);
        poVar3 = std::operator<<((ostream *)poVar5,(string *)&local_70);
        poVar3 = std::operator<<(poVar3,"}");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      }
      goto LAB_00297b3c;
    }
    ttype = t_type::get_true_type(ttype);
    is_owned = true;
  } while( true );
}

Assistant:

void t_rs_generator::render_const_value(t_type* ttype, t_const_value* tvalue, bool is_owned) {
  if (ttype->is_base_type()) {
    t_base_type* tbase_type = (t_base_type*)ttype;
    switch (tbase_type->get_base()) {
    case t_base_type::TYPE_STRING:
      if (tbase_type->is_binary()) {
        if (is_owned) {
          f_gen_ << "\"" << tvalue->get_string() << "\""<<  ".to_owned().into_bytes()";
        } else {
          f_gen_ << "b\"" << tvalue->get_string() << "\"";
        }
      } else {
        f_gen_ << "\"" << tvalue->get_string() << "\"";
        if (is_owned) {
          f_gen_ << ".to_owned()";
        }
      }
      break;
    case t_base_type::TYPE_BOOL:
      f_gen_ << (tvalue->get_integer() ? "true" : "false");
      break;
    case t_base_type::TYPE_I8:
    case t_base_type::TYPE_I16:
    case t_base_type::TYPE_I32:
    case t_base_type::TYPE_I64:
      f_gen_ << tvalue->get_integer();
      break;
    case t_base_type::TYPE_DOUBLE:
      f_gen_ << "OrderedFloat::from(" << tvalue->get_double() << "_f64)";
      break;
    default:
      throw "cannot generate const value for " + t_base_type::t_base_name(tbase_type->get_base());
    }
  } else if (ttype->is_typedef()) {
    render_const_value(get_true_type(ttype), tvalue);
  } else if (ttype->is_enum()) {
    f_gen_ << indent() << "{" << endl;
    indent_up();
    f_gen_
      << indent()
      << to_rust_type(ttype)
      << "::try_from("
      << tvalue->get_integer()
      << ").expect(\"expecting valid const value\")"
      << endl;
    indent_down();
    f_gen_ << indent() << "}" << endl;
  } else if (ttype->is_struct() || ttype->is_xception()) {
    render_const_struct(ttype, tvalue);
  } else if (ttype->is_container()) {
    f_gen_ << indent() << "{" << endl;
    indent_up();

    if (ttype->is_list()) {
      render_const_list(ttype, tvalue);
    } else if (ttype->is_set()) {
      render_const_set(ttype, tvalue);
    } else if (ttype->is_map()) {
      render_const_map(ttype, tvalue);
    } else {
      throw "cannot generate const container value for " + ttype->get_name();
    }

    indent_down();
    f_gen_ << indent() << "}" << endl;
  } else {
    throw "cannot generate const value for " + ttype->get_name();
  }
}